

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O0

char * Nm_ManStoreIdName(Nm_Man_t *p,int ObjId,int Type,char *pName,char *pSuffix)

{
  uint uVar1;
  int iVar2;
  Nm_Entry_t *pNVar3;
  size_t sVar4;
  size_t sVar5;
  char *local_68;
  int local_50;
  int nEntrySize;
  int RetValue;
  Nm_Entry_t *pEntry;
  char *pSuffix_local;
  char *pName_local;
  int Type_local;
  int ObjId_local;
  Nm_Man_t *p_local;
  
  pNVar3 = Nm_ManTableLookupId(p,ObjId);
  if (pNVar3 == (Nm_Entry_t *)0x0) {
    sVar4 = strlen(pName);
    if (pSuffix == (char *)0x0) {
      local_50 = 0;
    }
    else {
      sVar5 = strlen(pSuffix);
      local_50 = (int)sVar5;
    }
    uVar1 = (int)sVar4 + local_50 + 0x21;
    pNVar3 = (Nm_Entry_t *)
             Extra_MmFlexEntryFetch
                       (p->pMem,((int)((ulong)(long)(int)uVar1 >> 3) + (uint)((uVar1 & 7) != 0)) * 8
                       );
    pNVar3->pNameSake = (Nm_Entry_t *)0x0;
    pNVar3->pNextN2I = (Nm_Entry_t *)0x0;
    pNVar3->pNextI2N = (Nm_Entry_t *)0x0;
    pNVar3->ObjId = ObjId;
    pNVar3->Type = Type;
    local_68 = pSuffix;
    if (pSuffix == (char *)0x0) {
      local_68 = "";
    }
    sprintf((char *)(pNVar3 + 1),"%s%s",pName,local_68);
    iVar2 = Nm_ManTableAdd(p,pNVar3);
    if (iVar2 != 1) {
      __assert_fail("RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/nm/nmApi.c"
                    ,0x85,"char *Nm_ManStoreIdName(Nm_Man_t *, int, int, char *, char *)");
    }
    p_local = (Nm_Man_t *)(pNVar3 + 1);
  }
  else {
    printf("Nm_ManStoreIdName(): Entry with the same ID already exists.\n");
    p_local = (Nm_Man_t *)0x0;
  }
  return (char *)p_local;
}

Assistant:

char * Nm_ManStoreIdName( Nm_Man_t * p, int ObjId, int Type, char * pName, char * pSuffix )
{
    Nm_Entry_t * pEntry;
    int RetValue, nEntrySize;
    // check if the object with this ID is already stored
    if ( (pEntry = Nm_ManTableLookupId(p, ObjId)) )
    {
        printf( "Nm_ManStoreIdName(): Entry with the same ID already exists.\n" );
        return NULL;
    }
    // create a new entry
    nEntrySize = sizeof(Nm_Entry_t) + strlen(pName) + (pSuffix?strlen(pSuffix):0) + 1;
//    nEntrySize = (nEntrySize / 4 + ((nEntrySize % 4) > 0)) * 4;
    nEntrySize = (nEntrySize / sizeof(char*) + ((nEntrySize % sizeof(char*)) > 0)) * sizeof(char*); // added by Saurabh on Sep 3, 2009
    pEntry = (Nm_Entry_t *)Extra_MmFlexEntryFetch( p->pMem, nEntrySize );
    pEntry->pNextI2N = pEntry->pNextN2I = pEntry->pNameSake = NULL;
    pEntry->ObjId = ObjId;
    pEntry->Type = Type;
    sprintf( pEntry->Name, "%s%s", pName, pSuffix? pSuffix : "" );
    // add the entry to the hash table
    RetValue = Nm_ManTableAdd( p, pEntry );
    assert( RetValue == 1 );
    return pEntry->Name;
}